

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapLoader.cpp
# Opt level: O2

void __thiscall
AlternativeLoader::altSplitLine
          (AlternativeLoader *this,string *line,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *pLineWords,string *mode)

{
  bool bVar1;
  long lVar2;
  string delimiter;
  string mLine;
  string token;
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined1 local_a0 [16];
  value_type local_90;
  value_type local_70;
  string local_50 [32];
  
  std::__cxx11::string::string((string *)&local_90,(string *)line);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_b0 = local_a0;
  local_a8 = 0;
  local_a0[0] = 0;
  bVar1 = std::operator==(mode,"Map");
  if (!bVar1) {
    bVar1 = std::operator==(mode,"Continents");
    if (!bVar1) {
      std::__cxx11::string::assign((char *)&local_b0);
      while( true ) {
        lVar2 = std::__cxx11::string::find((string *)&local_90,(ulong)&local_b0);
        if (lVar2 == -1) break;
        std::__cxx11::string::substr((ulong)local_50,(ulong)&local_90);
        std::__cxx11::string::operator=((string *)&local_70,local_50);
        std::__cxx11::string::~string(local_50);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(pLineWords,&local_70);
        std::__cxx11::string::erase((ulong)&local_90,0);
      }
      goto LAB_00115c8f;
    }
  }
  std::__cxx11::string::assign((char *)&local_b0);
  while( true ) {
    lVar2 = std::__cxx11::string::find((string *)&local_90,(ulong)&local_b0);
    if (lVar2 == -1) break;
    std::__cxx11::string::substr((ulong)local_50,(ulong)&local_90);
    std::__cxx11::string::operator=((string *)&local_70,local_50);
    std::__cxx11::string::~string(local_50);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pLineWords,&local_70);
    std::__cxx11::string::erase((ulong)&local_90,0);
  }
LAB_00115c8f:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pLineWords,&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  return;
}

Assistant:

void AlternativeLoader::altSplitLine(const std::string &line, std::vector<std::string> *pLineWords, const std::string& mode) {
    std::string mLine = line;
    size_t pos;
    std::string token;
    std::string delimiter;
    if(mode == "Map" || mode == "Continents"){
        //split each line into vector of words (split by =)
        delimiter = "=";
        while((pos = mLine.find(delimiter)) != std::string::npos){
            token = mLine.substr(0,pos);
            pLineWords->push_back(token);
            mLine.erase(0,pos + delimiter.length());
        }
        pLineWords->push_back(mLine);
    }else{
        //split each line into vector of words (split by ,)
        delimiter = ",";
        while((pos = mLine.find(delimiter)) != std::string::npos){
            token = mLine.substr(0,pos);
            pLineWords->push_back(token);
            mLine.erase(0,pos + delimiter.length());
        }
        pLineWords->push_back(mLine);
    }
}